

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetDirectoryPropertiesCommand.h
# Opt level: O0

void __thiscall
cmSetDirectoryPropertiesCommand::~cmSetDirectoryPropertiesCommand
          (cmSetDirectoryPropertiesCommand *this)

{
  cmSetDirectoryPropertiesCommand *this_local;
  
  ~cmSetDirectoryPropertiesCommand(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

cmCommand* Clone() override { return new cmSetDirectoryPropertiesCommand; }